

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_parameters.cpp
# Opt level: O2

int __thiscall cpp_db::sqlite_parameters::find_param_pos(sqlite_parameters *this,string *name)

{
  int iVar1;
  sqlite3_stmt *psVar2;
  db_exception *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  psVar2 = get_stmt_handle(this);
  iVar1 = sqlite3_bind_parameter_index(psVar2,(name->_M_dataplus)._M_p);
  if (iVar1 != 0) {
    return iVar1;
  }
  this_00 = (db_exception *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_58,"Index for SQL parameter \'",name);
  std::operator+(&local_38,&bStack_58,"\' not found!");
  db_exception::db_exception(this_00,&local_38);
  __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int sqlite_parameters::find_param_pos(const std::string &name) const
{
	if (int pos = sqlite3_bind_parameter_index(get_stmt_handle(), name.c_str()))
        return pos;
    else
        throw db_exception("Index for SQL parameter '" + name + "' not found!");
}